

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

bool operator==(ON_String *lhs,ON_String *rhs)

{
  bool bVar1;
  int element_count1;
  int iVar2;
  char *string1;
  char *string2;
  
  element_count1 = ON_String::Length(lhs);
  iVar2 = ON_String::Length(rhs);
  if (element_count1 == iVar2) {
    string1 = ON_String::operator_cast_to_char_(lhs);
    string2 = ON_String::operator_cast_to_char_(rhs);
    bVar1 = ON_String::EqualOrdinal(string1,element_count1,string2,element_count1,false);
    return bVar1;
  }
  return false;
}

Assistant:

bool operator==( const ON_String& lhs, const ON_String& rhs )
{
  const int length = lhs.Length();
  return
    (length == rhs.Length())
    &&  ON_String::EqualOrdinal(
    static_cast<const char*>(lhs),
    length,
    static_cast<const char*>(rhs),
    length,
    false
    );
}